

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  lua_CFunction *pp_Var1;
  byte bVar2;
  StkId pTVar3;
  lua_CFunction p_Var4;
  uint uVar5;
  int iVar6;
  TValue *pTVar7;
  StkId pTVar8;
  ulong uVar9;
  CallInfo *pCVar10;
  uint uVar11;
  int *piVar12;
  StkId pTVar13;
  StkId base;
  long lVar14;
  long lVar15;
  bool bVar16;
  
  uVar5 = func->tt_;
  while( true ) {
    pTVar13 = L->stack;
    uVar5 = uVar5 & 0x3f;
    if (uVar5 == 6) {
      lVar15 = (long)func - (long)pTVar13;
      lVar14 = *(long *)((func->value_).f + 0x18);
      pTVar8 = L->top;
      if ((long)L->stack_last - (long)pTVar8 >> 4 <= (long)(ulong)*(byte *)(lVar14 + 0x7a)) {
        luaD_growstack(L,(uint)*(byte *)(lVar14 + 0x7a));
        pTVar8 = L->top;
        pTVar13 = L->stack;
      }
      pTVar13 = (StkId)((long)pTVar13 + lVar15);
      bVar2 = *(byte *)(lVar14 + 0x78);
      uVar5 = (int)((ulong)((long)pTVar8 - (long)pTVar13) >> 4) - 1;
      for (uVar11 = uVar5; (int)uVar11 < (int)(uint)bVar2; uVar11 = uVar11 + 1) {
        L->top = pTVar8 + 1;
        pTVar8->tt_ = 0;
        pTVar8 = pTVar8 + 1;
      }
      uVar11 = (uint)bVar2;
      if ((int)uVar5 <= (int)uVar11) {
        uVar5 = uVar11;
      }
      if (*(char *)(lVar14 + 0x79) == '\0') {
        pTVar8 = pTVar13 + 1;
      }
      else {
        piVar12 = &pTVar8[-(ulong)uVar5].tt_;
        uVar9 = (ulong)uVar11;
        while (bVar16 = uVar9 != 0, uVar9 = uVar9 - 1, bVar16) {
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          pTVar3->value_ = ((TValue *)(piVar12 + -2))->value_;
          pTVar3->tt_ = *piVar12;
          *piVar12 = 0;
          piVar12 = piVar12 + 4;
        }
      }
      pCVar10 = L->ci->next;
      if (pCVar10 == (CallInfo *)0x0) {
        pCVar10 = luaE_extendCI(L);
      }
      L->ci = pCVar10;
      pCVar10->nresults = (short)nresults;
      pCVar10->func = pTVar13;
      (pCVar10->u).l.base = pTVar8;
      bVar2 = *(byte *)(lVar14 + 0x7a);
      pCVar10->top = pTVar8 + bVar2;
      (pCVar10->u).l.savedpc = *(Instruction **)(lVar14 + 0x18);
      pCVar10->callstatus = '\x01';
      L->top = pTVar8 + bVar2;
      if ((L->hookmask & 1) != 0) {
        pp_Var1 = &(pCVar10->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        iVar6 = 0;
        if (((pCVar10->previous->callstatus & 1) != 0) &&
           ((*(uint *)((pCVar10->previous->u).c.k + -4) & 0x3f) == 0x1e)) {
          pCVar10->callstatus = 'A';
          iVar6 = 4;
        }
        luaD_hook(L,iVar6,-1);
        pp_Var1 = &(pCVar10->u).c.k;
        *pp_Var1 = *pp_Var1 + -4;
      }
      return 0;
    }
    pTVar7 = func;
    if (uVar5 == 0x16) break;
    if (uVar5 == 0x26) {
      pTVar7 = (TValue *)((func->value_).f + 0x18);
      break;
    }
    pTVar7 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar7->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar13 = L->stack;
    for (pTVar8 = L->top; func < pTVar8; pTVar8 = pTVar8 + -1) {
      pTVar8->value_ = pTVar8[-1].value_;
      pTVar8->tt_ = pTVar8[-1].tt_;
    }
    pTVar8 = L->top;
    L->top = pTVar8 + 1;
    if ((long)L->stack_last - (long)(pTVar8 + 1) < 0x10) {
      luaD_growstack(L,0);
    }
    lVar14 = (long)func - (long)pTVar13;
    pTVar13 = L->stack;
    *(Value *)((long)pTVar13 + lVar14) = pTVar7->value_;
    uVar5 = pTVar7->tt_;
    *(uint *)((long)pTVar13 + lVar14 + 8) = uVar5;
    func = (StkId)(lVar14 + (long)pTVar13);
  }
  p_Var4 = (pTVar7->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    luaD_growstack(L,0x14);
  }
  pCVar10 = L->ci->next;
  if (pCVar10 == (CallInfo *)0x0) {
    pCVar10 = luaE_extendCI(L);
  }
  L->ci = pCVar10;
  pCVar10->nresults = (short)nresults;
  pCVar10->func = (StkId)(((long)func - (long)pTVar13) + (long)L->stack);
  pCVar10->top = L->top + 0x14;
  pCVar10->callstatus = '\0';
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar6 = (*p_Var4)(L);
  luaD_poscall(L,L->top + -(long)iVar6);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      luaD_checkstack(L, p->maxstacksize);
      func = restorestack(L, funcr);
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      base = (!p->is_vararg) ? func + 1 : adjust_varargs(L, p, n);
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}